

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int nng_dialer_close(nng_dialer did)

{
  int iVar1;
  nni_dialer *in_RAX;
  nni_dialer *local_18;
  nni_dialer *d;
  
  local_18 = in_RAX;
  iVar1 = nni_dialer_find(&local_18,did.id);
  if (iVar1 == 0) {
    nni_dialer_close(local_18);
  }
  return iVar1;
}

Assistant:

int
nng_dialer_close(nng_dialer did)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, did.id)) != 0) {
		return (rv);
	}
	nni_dialer_close(d);
	return (0);
}